

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkageUntangler.cc
# Opt level: O1

void __thiscall LinkageUntangler::report_selection(LinkageUntangler *this)

{
  ostream *poVar1;
  ulong uVar2;
  long lVar3;
  
  uVar2 = (*(long *)(**(long **)this + 0x48) - *(long *)(**(long **)this + 0x40) >> 3) *
          0x6db6db6db6db6db7;
  if (1 < uVar2) {
    lVar3 = 1;
    do {
      lVar3 = lVar3 + 1;
    } while (uVar2 - lVar3 != 0);
  }
  poVar1 = sdglib::OutputLog(INFO,true);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Current selection: ",0x13);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," / ",3);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," nodes  with  ",0xe);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," / ",3);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," bp",3);
  std::ios::widen((char)poVar1->_vptr_basic_ostream[-3] + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void LinkageUntangler::report_selection() {
    uint64_t total_bp=0,total_count=0,selected_bp=0,selected_count=0;
    for (auto n=1;n<dg.sdg.nodes.size();++n) {
        if (dg.sdg.nodes[n].status == NodeStatus::Deleted) continue;
        total_bp+=dg.sdg.nodes[n].sequence.size();
        ++total_count;
        if (selected_nodes[n]) {
            selected_bp += dg.sdg.nodes[n].sequence.size();
            ++selected_count;
        }
    }
        sdglib::OutputLog()<< "Current selection: "<<selected_count<<" / "<<total_count<<" nodes  with  "<<selected_bp<<" / "<<total_bp<<" bp"<<std::endl;

}